

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

boolean find_misc(monst *mtmp,musable *m)

{
  uint y;
  char cVar1;
  char cVar2;
  short sVar3;
  permonst *ptr;
  monst *pmVar4;
  boolean bVar5;
  int iVar6;
  trap *ptVar7;
  obj *poVar8;
  uint x0;
  uint x;
  bool bVar9;
  bool bVar10;
  
  pmVar4 = u.ustuck;
  ptr = mtmp->data;
  x0 = (uint)mtmp->mx;
  cVar1 = mtmp->my;
  cVar2 = ptr->mmove;
  m->misc = (obj *)0x0;
  m->has_misc = MUSE_NONE;
  if ((((ptr->mflags1 & 0x50000) == 0) && ((u._1052_1_ & pmVar4 == mtmp) == 0)) &&
     (iVar6 = dist2(x0,(int)cVar1,(int)mtmp->mux,(int)mtmp->muy), iVar6 < 0x25)) {
    if (((pmVar4 != mtmp) && (cVar2 != '\0')) &&
       (((mtmp->field_0x60 & 0x70) == 0 && (iVar6 = monsndx(ptr), monstr[iVar6] < 6)))) {
      if (ptr->msize == '\0') {
        bVar9 = false;
      }
      else if ((ptr->mflags2 & 0x8000000) == 0) {
        bVar9 = (ptr->mflags1 & 8) == 0;
      }
      else {
        bVar9 = false;
      }
      x = x0 - 1;
      do {
        iVar6 = -1;
        do {
          y = iVar6 + cVar1;
          if ((((y < 0x15 && x - 1 < 0x4f) && ((int)u.uy != y || (int)u.ux != x)) &&
              ((iVar6 == 0 || (x == x0 || ptr != mons + 0x78) &&
               ((level->monsters[x][y] == (monst *)0x0 &&
                (ptVar7 = t_at(level,x,y), ptVar7 != (trap *)0x0)))))) &&
             (((!bVar9 || (poVar8 = sobj_at(0x214,level,x,y), poVar8 == (obj *)0x0)) &&
              ((bVar5 = onscary(x,y,mtmp), bVar5 == '\0' && ((ptVar7->field_0x8 & 0x1f) == 0x17)))))
             ) {
            trapx = x;
            trapy = y;
            m->has_misc = MUSE_POLY_TRAP;
            return '\x01';
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != 2);
        bVar10 = x != x0 + 1;
        x = x + 1;
      } while (bVar10);
    }
    if ((ptr->mflags1 & 0x2000) == 0) {
      for (poVar8 = mtmp->minvent; poVar8 != (obj *)0x0; poVar8 = poVar8->nobj) {
        sVar3 = poVar8->otyp;
        if ((sVar3 == 299) && (((poVar8->field_0x4a & 1) == 0 || ((mtmp->field_0x63 & 0x1a) == 0))))
        {
          m->misc = poVar8;
          m->has_misc = MUSE_POT_GAIN_LEVEL;
        }
        if (m->has_misc != MUSE_BULLWHIP) {
          if ((((sVar3 == 0x41) && (mtmp->mw == poVar8)) &&
              (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar6 == 1)) &&
             ((uwep != (obj *)0x0 && ((mtmp->field_0x62 & 0x40) == 0)))) {
            m->misc = poVar8;
            m->has_misc = MUSE_BULLWHIP;
          }
          if (m->has_misc != MUSE_WAN_MAKE_INVISIBLE) {
            if (((((poVar8->otyp == 0x1c5) && ('\0' < poVar8->spe)) &&
                 ((*(uint *)&mtmp->field_0x60 & 6) == 0)) &&
                (((((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0 || (u.uprops[0xc].intrinsic != 0))
                  || (u.uprops[0xc].extrinsic != 0)) ||
                 (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
               ((bVar5 = attacktype(mtmp->data,0xf), bVar5 == '\0' || ((mtmp->field_0x61 & 1) != 0))
               )) {
              m->misc = poVar8;
              m->has_misc = MUSE_WAN_MAKE_INVISIBLE;
            }
            if (m->has_misc != MUSE_POT_INVISIBILITY) {
              if (((poVar8->otyp == 0x135) && ((*(uint *)&mtmp->field_0x60 & 6) == 0)) &&
                 ((((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0 ||
                   (((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)) ||
                    (((youmonst.data)->mflags1 & 0x1000000) != 0)))) &&
                  ((bVar5 = attacktype(mtmp->data,0xf), bVar5 == '\0' ||
                   ((mtmp->field_0x61 & 1) != 0)))))) {
                m->misc = poVar8;
                m->has_misc = MUSE_POT_INVISIBILITY;
              }
              if (m->has_misc != MUSE_WAN_SPEED_MONSTER) {
                sVar3 = poVar8->otyp;
                if (((sVar3 == 0x1c7) && ('\0' < poVar8->spe)) &&
                   (((byte)(*(uint *)&mtmp->field_0x60 >> 0x1b) & 1) == 0 &&
                    (*(uint *)&mtmp->field_0x60 & 0xc00) != 0x800)) {
                  m->misc = poVar8;
                  m->has_misc = MUSE_WAN_SPEED_MONSTER;
                }
                if (m->has_misc != MUSE_POT_SPEED) {
                  if ((sVar3 == 0x12f) &&
                     (((byte)(*(uint *)&mtmp->field_0x60 >> 0x1b) & 1) == 0 &&
                      (*(uint *)&mtmp->field_0x60 & 0xc00) != 0x800)) {
                    m->misc = poVar8;
                    m->has_misc = MUSE_POT_SPEED;
                  }
                  if (m->has_misc != MUSE_WAN_POLYMORPH) {
                    if ((((sVar3 == 0x1c9) && ('\0' < poVar8->spe)) &&
                        ((mtmp->field_0x60 & 0x70) == 0)) &&
                       (iVar6 = monsndx(ptr), monstr[iVar6] < 6)) {
                      m->misc = poVar8;
                      m->has_misc = MUSE_WAN_POLYMORPH;
                    }
                    if (((m->has_misc != MUSE_POT_POLYMORPH) && (poVar8->otyp == 0x13a)) &&
                       (((mtmp->field_0x60 & 0x70) == 0 && (iVar6 = monsndx(ptr), monstr[iVar6] < 6)
                        ))) {
                      m->misc = poVar8;
                      m->has_misc = MUSE_POT_POLYMORPH;
                    }
                  }
                }
              }
            }
          }
        }
      }
      return m->has_misc != MUSE_NONE;
    }
  }
  return '\0';
}

Assistant:

boolean find_misc(struct monst *mtmp, struct musable *m)
{
	struct obj *obj;
	const struct permonst *mdat = mtmp->data;
	int x = mtmp->mx, y = mtmp->my;
	struct trap *t;
	int xx, yy;
	boolean immobile = (mdat->mmove == 0);
	boolean stuck = (mtmp == u.ustuck);

	m->misc = NULL;
	m->has_misc = 0;
	if (is_animal(mdat) || mindless(mdat))
		return 0;
	if (u.uswallow && stuck) return FALSE;

	/* We arbitrarily limit to times when a player is nearby for the
	 * same reason as Junior Pac-Man doesn't have energizers eaten until
	 * you can see them...
	 */
	if (dist2(x, y, mtmp->mux, mtmp->muy) > 36)
		return FALSE;

	if (!stuck && !immobile && !mtmp->cham && monstr[monsndx(mdat)] < 6) {
	  boolean ignore_boulders = (verysmall(mdat) ||
				     throws_rocks(mdat) ||
				     passes_walls(mdat));
	  for (xx = x-1; xx <= x+1; xx++)
	    for (yy = y-1; yy <= y+1; yy++)
		if (isok(xx,yy) && (xx != u.ux || yy != u.uy))
		    if (mdat != &mons[PM_GRID_BUG] || xx == x || yy == y)
			if (/* (xx==x && yy==y) || */ !level->monsters[xx][yy])
			    if ((t = t_at(level, xx, yy)) != 0 &&
			      (ignore_boulders || !sobj_at(BOULDER, level, xx, yy))
			      && !onscary(xx, yy, mtmp)) {
				if (t->ttyp == POLY_TRAP) {
				    trapx = xx;
				    trapy = yy;
				    m->has_misc = MUSE_POLY_TRAP;
				    return TRUE;
				}
			    }
	}
	if (nohands(mdat))
		return 0;

#define nomore(x) if (m->has_misc==x) continue;
	for (obj=mtmp->minvent; obj; obj=obj->nobj) {
		/* Monsters shouldn't recognize cursed items; this kludge is */
		/* necessary to prevent serious problems though... */
		if (obj->otyp == POT_GAIN_LEVEL && (!obj->cursed ||
			    (!mtmp->isgd && !mtmp->isshk && !mtmp->ispriest))) {
			m->misc = obj;
			m->has_misc = MUSE_POT_GAIN_LEVEL;
		}
		nomore(MUSE_BULLWHIP);
		if (obj->otyp == BULLWHIP && (MON_WEP(mtmp) == obj) &&
		   distu(mtmp->mx,mtmp->my)==1 && uwep && !mtmp->mpeaceful) {
			m->misc = obj;
			m->has_misc = MUSE_BULLWHIP;
		}
		/* Note: peaceful/tame monsters won't make themselves
		 * invisible unless you can see them.  Not really right, but...
		 */
		nomore(MUSE_WAN_MAKE_INVISIBLE);
		if (obj->otyp == WAN_MAKE_INVISIBLE && obj->spe > 0 &&
		    !mtmp->minvis && !mtmp->invis_blkd &&
		    (!mtmp->mpeaceful || See_invisible) &&
		    (!attacktype(mtmp->data, AT_GAZE) || mtmp->mcan)) {
			m->misc = obj;
			m->has_misc = MUSE_WAN_MAKE_INVISIBLE;
		}
		nomore(MUSE_POT_INVISIBILITY);
		if (obj->otyp == POT_INVISIBILITY &&
		    !mtmp->minvis && !mtmp->invis_blkd &&
		    (!mtmp->mpeaceful || See_invisible) &&
		    (!attacktype(mtmp->data, AT_GAZE) || mtmp->mcan)) {
			m->misc = obj;
			m->has_misc = MUSE_POT_INVISIBILITY;
		}
		nomore(MUSE_WAN_SPEED_MONSTER);
		if (obj->otyp == WAN_SPEED_MONSTER && obj->spe > 0
				&& mtmp->mspeed != MFAST && !mtmp->isgd) {
			m->misc = obj;
			m->has_misc = MUSE_WAN_SPEED_MONSTER;
		}
		nomore(MUSE_POT_SPEED);
		if (obj->otyp == POT_SPEED && mtmp->mspeed != MFAST
							&& !mtmp->isgd) {
			m->misc = obj;
			m->has_misc = MUSE_POT_SPEED;
		}
		nomore(MUSE_WAN_POLYMORPH);
		if (obj->otyp == WAN_POLYMORPH && obj->spe > 0 && !mtmp->cham
				&& monstr[monsndx(mdat)] < 6) {
			m->misc = obj;
			m->has_misc = MUSE_WAN_POLYMORPH;
		}
		nomore(MUSE_POT_POLYMORPH);
		if (obj->otyp == POT_POLYMORPH && !mtmp->cham
				&& monstr[monsndx(mdat)] < 6) {
			m->misc = obj;
			m->has_misc = MUSE_POT_POLYMORPH;
		}
	}
	return (boolean)(!!m->has_misc);
#undef nomore
}